

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O3

char * string_from_atom(atom_server as,atom_t atom)

{
  int iVar1;
  Tcl_HashEntry *pTVar2;
  size_t sVar3;
  ssize_t sVar4;
  char *pcVar5;
  long lVar6;
  send_get_atom_msg_ptr msg;
  char buf [100];
  char local_88 [2];
  _send_get_atom_msg local_86 [6];
  
  pTVar2 = (*(as->value_hash_table).findProc)(&as->value_hash_table,(char *)(long)atom);
  if (pTVar2 == (Tcl_HashEntry *)0x0) {
    pcVar5 = local_88 + 1;
    iVar1 = 0x108110;
    sprintf(pcVar5,"N%d",atom);
    iVar1 = establish_server_connection(as,iVar1);
    if (iVar1 == 0) {
      return (char *)0x0;
    }
    sVar3 = strlen(pcVar5);
    local_88[0] = (char)sVar3;
    lVar6 = (long)local_88[0];
    sVar3 = write(as->tcp_fd,local_88,lVar6 + 1U);
    if (sVar3 == lVar6 + 1U) {
      set_blocking(as,1);
      local_88[1] = '\0';
      do {
        sVar4 = read(as->tcp_fd,local_88,1);
        if ((int)sVar4 == -1) {
          pcVar5 = "read";
          goto LAB_00103f01;
        }
        sVar4 = read(as->tcp_fd,pcVar5,(long)local_88[0]);
        if ((int)sVar4 != (int)local_88[0]) {
          pcVar5 = "read2";
          goto LAB_00103f01;
        }
        local_88[(int)sVar4 + 1] = '\0';
      } while ((local_88[1] != 'S') && (handle_unexpected_msg(as,pcVar5), local_88[1] != 'S'));
      if ((char)local_86[0].atom_string != '\0') {
        msg = (send_get_atom_msg_ptr)(local_88 + 2);
        enter_atom_into_cache(as,msg);
        goto LAB_00103edb;
      }
    }
    else {
      pcVar5 = "write";
LAB_00103f01:
      perror(pcVar5);
    }
  }
  else {
    msg = *pTVar2->clientData;
    if (msg != (send_get_atom_msg_ptr)0x0) {
LAB_00103edb:
      pcVar5 = strdup((char *)msg);
      return pcVar5;
    }
  }
  return (char *)0x0;
}

Assistant:

extern
char *
string_from_atom(atom_server as, atom_t atom)
{
    send_get_atom_msg tmp_rec;
    send_get_atom_msg_ptr stored;
    Tcl_HashEntry *entry = NULL;
    int numbytes;
    char buf[MAXDATASIZE];

    entry = Tcl_FindHashEntry(&as->value_hash_table, (char *) (int64_t) atom);

    if (entry == NULL) {
	sprintf(&buf[1], "N%d", atom);
	if (establish_server_connection(as, 1) == 0) return NULL;
	buf[0] = (char) strlen(&buf[1]);
	if (write(as->tcp_fd, buf, buf[0]+1) != buf[0] + 1) {
	    perror("write");
	    return NULL;
	}
	set_blocking(as, 1);	/* set server fd blocking */
	buf[1] = 0;
	while (buf[1] != 'S') {
	    if ((numbytes = read(as->tcp_fd, buf, 1)) == -1) {
		perror("read");
		return NULL;
	    }
	    if ((numbytes = read(as->tcp_fd, &buf[1], buf[0])) != buf[0]) {
		perror("read2");
		return NULL;
	    }
	    buf[numbytes+1] = 0;
	    if (buf[1] != 'S')
		handle_unexpected_msg(as, &buf[1]);
	}

	if (buf[2] == 0) {
	    return NULL;
	}
	tmp_rec.atom_string = &buf[2];
	tmp_rec.atom = atom;

	(void) enter_atom_into_cache(as, &tmp_rec);
	stored = &tmp_rec;
    } else {
	stored = (send_get_atom_msg_ptr) Tcl_GetHashValue(entry);
    }
    if (stored->atom_string != NULL) {
	return strdup(stored->atom_string);
    } else {
	return NULL;
    }
}